

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

any __thiscall Json::init_right_of_pair(Json *this,string *s,size_t *start)

{
  char c;
  size_type sVar1;
  bool bVar2;
  __type _Var3;
  size_t sVar4;
  undefined8 *puVar5;
  size_t *in_RCX;
  _Storage extraout_RDX;
  __node_base _Var6;
  size_t current;
  any aVar7;
  JsonTools j;
  string str;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  current = *in_RCX;
  *(undefined8 *)&(this->object)._M_t._M_impl = 0;
  *(undefined8 *)&(this->object)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  c = *(char *)(*start + current);
  if (c == '{') {
    sVar4 = JsonTools::size_of_item((string *)start,current,'{','}');
    std::__cxx11::string::substr((ulong)&j,(ulong)start);
    std::__cxx11::string::operator=((string *)&str,(string *)&j);
    std::__cxx11::string::~string((string *)&j);
    Json((Json *)&j,&str);
    std::any::operator=((any *)this,(Json *)&j);
  }
  else {
    if (c != '[') {
      if (c == '\"') {
        JsonTools::parse_string_literally((string *)&j,(string *)start,current + 1);
        std::__cxx11::string::operator=((string *)&str,(string *)&j);
        std::__cxx11::string::~string((string *)&j);
        current = current + 1 + str._M_string_length;
        std::any::operator=((any *)this,&str);
      }
      else {
        bVar2 = JsonTools::is_digit(c);
        if (bVar2) {
          JsonTools::parse_number((string *)&j,(string *)start,*in_RCX);
          std::__cxx11::string::operator=((string *)&str,(string *)&j);
          std::__cxx11::string::~string((string *)&j);
          sVar1 = str._M_string_length;
          j.allowedLexems._M_h._M_buckets = (__buckets_ptr)atof(str._M_dataplus._M_p);
          std::any::operator=((any *)this,(double *)&j);
          current = (current + sVar1) - 1;
        }
        else {
          JsonTools::JsonTools(&j);
          bVar2 = false;
          for (_Var6 = j.allowedLexems._M_h._M_before_begin; _Var6._M_nxt != (_Hash_node_base *)0x0;
              _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt) {
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
            ::pair(&p,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                       *)(_Var6._M_nxt + 1));
            std::__cxx11::string::substr((ulong)&local_50,(ulong)start);
            _Var3 = std::operator==(&local_50,&p.first);
            std::__cxx11::string::~string((string *)&local_50);
            sVar1 = p.first._M_string_length;
            if (_Var3) {
              std::any::operator=((any *)this,&p.second);
              current = current + sVar1;
              bVar2 = true;
            }
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
            ::~pair(&p);
            if (_Var3) break;
          }
          if (!bVar2) {
            puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
            *puVar5 = &PTR__exception_001373a8;
            puVar5[1] = "Unexpected symbol!";
            __cxa_throw(puVar5,&json_exception::JsonException::typeinfo,std::exception::~exception);
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&j);
        }
      }
      goto LAB_001091f9;
    }
    sVar4 = JsonTools::size_of_item((string *)start,current,'[',']');
    std::__cxx11::string::substr((ulong)&j,(ulong)start);
    std::__cxx11::string::operator=((string *)&str,(string *)&j);
    std::__cxx11::string::~string((string *)&j);
    Json((Json *)&j,&str);
    std::any::operator=((any *)this,(Json *)&j);
  }
  ~Json((Json *)&j);
  current = current + sVar4;
LAB_001091f9:
  *in_RCX = current;
  std::__cxx11::string::~string((string *)&str);
  aVar7._M_storage._M_ptr = extraout_RDX._M_ptr;
  aVar7._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)this;
  return aVar7;
}

Assistant:

any Json::init_right_of_pair(string& s, size_t& start) {
	size_t i = start;
	any value;
	string str;
	if (s[i] == '\"') {
		str = JsonTools::parse_string_literally(s, start + 1);
		i += str.size() + 1;
		value = str;
	} else if (s[i] == '[') {
		size_t end = JsonTools::size_of_item(s, i, '[', ']');
		str = s.substr(i, end);
		value = Json(str);
		i += end;
	} else if (s[i] == '{') {
		size_t end = JsonTools::size_of_item(s, i, '{', '}');
		str = s.substr(i, end);
		value = Json(str);
		i += end;
	} else if (JsonTools::is_digit(s[i])) {
		str = JsonTools::parse_number(s, start);
		i += str.size() - 1;
		value = atof(str.c_str());
	} else {
		bool gotit = false;
		JsonTools j;
		for (auto p : j.allowedLexems) {
			if (s.substr(i, p.first.length()) == p.first) {
				i += p.first.length();
				value = p.second;
				gotit = true;
				break;
			}
		}
		if (!gotit) throw json_exception::JsonException("Unexpected symbol!");
	}
	start = i;
	return value;
}